

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint::MergePartialFromCodedStream
          (VisionFeaturePrint *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint32 uVar7;
  VisionFeaturePrint_Scene *this_00;
  ulong extraout_RAX;
  VisionFeaturePrint_Objects *this_01;
  ulong extraout_RAX_00;
  ulong uVar8;
  int local_38;
  int local_34;
  
  do {
    pbVar3 = input->buffer_;
    uVar7 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar8 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar5 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar7 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar7 = uVar5, (~(uint)*pbVar1 & uVar5) < 0x80))
        goto LAB_0026003f;
        uVar8 = (ulong)((uVar5 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar8 = uVar8 | 0x100000000;
    }
    else {
LAB_0026003f:
      uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar8 = 0;
      if (uVar7 - 1 < 0x3fff) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar7 | uVar8;
    }
    uVar7 = (uint32)uVar8;
    if ((uVar8 & 0x100000000) == 0) {
LAB_0025ffa6:
      iVar6 = 7;
      if ((uVar7 & 7) != 4 && uVar7 != 0) {
        bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar7);
        if (bVar4) goto LAB_0025ffcf;
        iVar6 = 6;
      }
    }
    else {
      uVar5 = (uint)(uVar8 >> 3) & 0x1fffffff;
      if (uVar5 == 0x15) {
        if ((char)uVar8 != -0x56) goto LAB_0025ffa6;
        if (this->_oneof_case_[0] != 0x15) {
          clear_VisionFeaturePrintType(this);
          this->_oneof_case_[0] = 0x15;
          this_01 = (VisionFeaturePrint_Objects *)operator_new(0x30);
          VisionFeaturePrint_Objects::VisionFeaturePrint_Objects(this_01);
          (this->VisionFeaturePrintType_).objects_ = this_01;
        }
        MergePartialFromCodedStream();
        iVar6 = local_38;
        if ((extraout_RAX_00 & 1) == 0) goto LAB_0025ffcf;
      }
      else {
        if ((uVar5 != 0x14) || ((char)uVar8 != -0x5e)) goto LAB_0025ffa6;
        if (this->_oneof_case_[0] != 0x14) {
          clear_VisionFeaturePrintType(this);
          this->_oneof_case_[0] = 0x14;
          this_00 = (VisionFeaturePrint_Scene *)operator_new(0x18);
          VisionFeaturePrint_Scene::VisionFeaturePrint_Scene(this_00);
          (this->VisionFeaturePrintType_).scene_ = this_00;
        }
        MergePartialFromCodedStream();
        iVar6 = local_34;
        if ((extraout_RAX & 1) != 0) goto LAB_0025ffd1;
LAB_0025ffcf:
        iVar6 = 0;
      }
    }
LAB_0025ffd1:
    if (iVar6 != 0) {
      return iVar6 != 6;
    }
  } while( true );
}

Assistant:

bool VisionFeaturePrint::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.CoreMLModels.VisionFeaturePrint)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.CoreMLModels.VisionFeaturePrint.Scene scene = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_scene()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects objects = 21;
      case 21: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(170u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_objects()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.CoreMLModels.VisionFeaturePrint)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.CoreMLModels.VisionFeaturePrint)
  return false;
#undef DO_
}